

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

string * __thiscall
VECTOR_HORI_VERT::Vector::get_filename_abi_cxx11_(string *__return_storage_ptr__,Vector *this)

{
  Vector *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->filename_);
  return __return_storage_ptr__;
}

Assistant:

std::string Vector::get_filename() const {
    return filename_;
  }